

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::RemoveLogSink(LogSink *destination)

{
  vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *this;
  int iVar1;
  iterator local_150;
  _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink*const*,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>,std::__debug::vector<google::LogSink*,std::allocator<google::LogSink*>>,std::forward_iterator_tag>
  local_128 [40];
  _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
  local_100;
  _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
  local_d8;
  _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink*const*,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>,std::__debug::vector<google::LogSink*,std::allocator<google::LogSink*>>,std::forward_iterator_tag>
  local_b0 [40];
  _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
  local_88;
  _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
  local_60;
  LogSink *local_38;
  LogSink *destination_local;
  MutexLock l;
  
  destination_local = (LogSink *)sink_mutex_;
  local_38 = destination;
  if (sink_mutex_[0x38] == '\x01') {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)sink_mutex_);
    if (iVar1 != 0) {
      abort();
    }
  }
  this = sinks_;
  if (sinks_ != (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    __gnu_debug::
    _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
    ::_Safe_iterator(&local_100,
                     (__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
                      )(sinks_->super_vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>)
                       .super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,(_Safe_sequence_base *)sinks_);
    __gnu_debug::
    _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
    ::_Safe_iterator(&local_d8,
                     (__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
                      )(sinks_->super_vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>)
                       .super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(_Safe_sequence_base *)sinks_);
    std::
    remove<__gnu_debug::_Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink**,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>,std::__debug::vector<google::LogSink*,std::allocator<google::LogSink*>>,std::random_access_iterator_tag>,google::LogSink*>
              ((_Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::random_access_iterator_tag>
                *)&local_60,
               (_Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::random_access_iterator_tag>
                *)&local_100,
               (_Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::random_access_iterator_tag>
                *)&local_d8,&local_38);
    __gnu_debug::
    _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink*const*,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>,std::__debug::vector<google::LogSink*,std::allocator<google::LogSink*>>,std::forward_iterator_tag>
    ::
    _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink**,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>>
              (local_128,&local_60);
    __gnu_debug::
    _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
    ::_Safe_iterator(&local_88,
                     (__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
                      )(sinks_->super_vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>)
                       .super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(_Safe_sequence_base *)sinks_);
    __gnu_debug::
    _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink*const*,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>,std::__debug::vector<google::LogSink*,std::allocator<google::LogSink*>>,std::forward_iterator_tag>
    ::
    _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink**,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>>
              (local_b0,&local_88);
    std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::erase
              (&local_150,this,(const_iterator *)local_128,(const_iterator *)local_b0);
    __gnu_debug::_Safe_iterator_base::_M_detach();
    __gnu_debug::_Safe_iterator_base::_M_detach();
    __gnu_debug::_Safe_iterator_base::_M_detach();
    __gnu_debug::_Safe_iterator_base::_M_detach();
    __gnu_debug::_Safe_iterator_base::_M_detach();
    __gnu_debug::_Safe_iterator_base::_M_detach();
    __gnu_debug::_Safe_iterator_base::_M_detach();
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock((MutexLock *)&destination_local);
  return;
}

Assistant:

inline void LogDestination::RemoveLogSink(LogSink *destination) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&sink_mutex_);
  // This doesn't keep the sinks in order, but who cares?
  if (sinks_) {
    sinks_->erase(std::remove(sinks_->begin(), sinks_->end(), destination), sinks_->end());
  }
}